

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_manual_wal_flush(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *it;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  uchar start_key2 [11];
  uchar start_key1 [11];
  uchar key2 [17];
  uchar key1 [15];
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffe28;
  undefined2 uVar2;
  undefined2 in_stack_fffffffffffffe2a;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffe2c;
  size_t in_stack_fffffffffffffe30;
  fdb_iterator *in_stack_fffffffffffffe38;
  fdb_iterator *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  size_t keylen;
  void *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar4;
  fdb_doc **in_stack_fffffffffffffea0;
  fdb_iterator *in_stack_fffffffffffffea8;
  fdb_iterator *local_c0;
  fdb_status local_b4;
  undefined8 local_b0;
  fdb_kvs_handle *local_a8;
  fdb_kvs_handle *local_a0;
  undefined8 local_8e;
  undefined2 local_86;
  undefined1 local_84;
  undefined8 local_83;
  undefined2 local_7b;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined8 local_63;
  undefined4 local_5b;
  undefined2 local_57;
  undefined1 local_55;
  int local_54;
  fdb_kvs_handle **in_stack_ffffffffffffffe0;
  fdb_file_handle *in_stack_ffffffffffffffe8;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  local_63 = 0x313032343e3e0508;
  local_5b = 0x3106002d;
  local_57 = 0;
  local_55 = 0;
  local_78 = 0x313032343e3e0508;
  local_70 = 0x323106002d31;
  local_68 = 0;
  local_83 = 0x393931343e3e0508;
  local_7b = 0x2d39;
  local_79 = 0;
  local_8e = 0x353433343e3e0508;
  local_86 = 0x140a;
  local_84 = 0;
  local_b0 = 0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  keylen = 0x400;
  uVar4 = 1;
  local_54 = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_open((fdb_file_handle **)fconfig.compactor_sleep_duration,
           (char *)fconfig.compaction_minimum_filesize,(fdb_config *)fconfig._40_8_);
  fdb_kvs_open(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(char *)local_10.tv_usec,
               (fdb_kvs_config *)local_10.tv_sec);
  fdb_kvs_open(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(char *)local_10.tv_usec,
               (fdb_kvs_config *)local_10.tv_sec);
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(uVar4,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60,
             keylen,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(uVar4,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60,
             keylen,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_commit((fdb_file_handle *)
             CONCAT44(in_stack_fffffffffffffe2c,
                      CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28)),'\0');
  uVar2 = 0;
  uVar3 = 0;
  local_b4 = fdb_iterator_init(local_a0,&local_c0,&local_83,0xb,(void *)0x0,0,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd8b);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xd8b,"void iterator_manual_wal_flush()");
    }
  }
  do {
    local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (local_b4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xd8e);
      iterator_manual_wal_flush::__test_pass = 0;
      if (local_b4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xd8e,"void iterator_manual_wal_flush()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11c9b7);
    local_b0 = 0;
    fVar1 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffe2c,CONCAT22(uVar3,uVar2)));
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffe38);
  uVar2 = 0;
  uVar3 = 0;
  local_b4 = fdb_iterator_init(local_a0,&local_c0,&local_8e,0xb,(void *)0x0,0,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd97);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xd97,"void iterator_manual_wal_flush()");
    }
  }
  local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (local_b4 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd99);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 == FDB_RESULT_SUCCESS) {
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xd99,"void iterator_manual_wal_flush()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffe38);
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(uVar4,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60,
             keylen,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(uVar4,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60,
             keylen,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_commit((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffe2c,CONCAT22(uVar3,uVar2)),'\0');
  uVar2 = 0;
  uVar3 = 0;
  local_b4 = fdb_iterator_init(local_a8,&local_c0,&local_83,0xb,(void *)0x0,0,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xda5);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xda5,"void iterator_manual_wal_flush()");
    }
  }
  do {
    local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (local_b4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xda8);
      iterator_manual_wal_flush::__test_pass = 0;
      if (local_b4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xda8,"void iterator_manual_wal_flush()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11cc98);
    local_b0 = 0;
    fVar1 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffe2c,CONCAT22(uVar3,uVar2)));
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffe38);
  local_b4 = fdb_iterator_init(local_a0,&local_c0,&local_8e,0xb,(void *)0x0,0,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdb1);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdb1,"void iterator_manual_wal_flush()");
    }
  }
  local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (local_b4 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdb3);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 == FDB_RESULT_SUCCESS) {
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdb3,"void iterator_manual_wal_flush()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffe38);
  local_b4 = fdb_iterator_init(local_a8,&local_c0,(void *)0x0,0,&local_83,0xb,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdb9);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdb9,"void iterator_manual_wal_flush()");
    }
  }
  local_b4 = fdb_iterator_seek(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                               in_stack_fffffffffffffe30,
                               (fdb_iterator_seek_opt_t)((uint)in_stack_fffffffffffffe2c >> 0x18));
  if (local_b4 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdbb);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 == FDB_RESULT_SUCCESS) {
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdbb,"void iterator_manual_wal_flush()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffe38);
  uVar2 = 0;
  uVar3 = 0;
  local_b4 = fdb_iterator_init(local_a0,&local_c0,(void *)0x0,0,&local_8e,0xb,0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdc1);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdc1,"void iterator_manual_wal_flush()");
    }
  }
  local_b4 = fdb_iterator_seek(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                               in_stack_fffffffffffffe30,
                               (fdb_iterator_seek_opt_t)((uint)in_stack_fffffffffffffe2c >> 0x18));
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdc3);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdc3,"void iterator_manual_wal_flush()");
    }
  }
  local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (local_b4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdc5);
    iterator_manual_wal_flush::__test_pass = 0;
    if (local_b4 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdc5,"void iterator_manual_wal_flush()");
    }
  }
  fdb_doc_free((fdb_doc *)0x11d0e3);
  do {
    local_b0 = 0;
    fVar1 = fdb_iterator_prev((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffe2c,CONCAT22(uVar3,uVar2)));
    if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close(in_stack_fffffffffffffe38);
      fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffe2c,CONCAT22(uVar3,uVar2)));
      fdb_shutdown();
      memleak_end();
      if (iterator_manual_wal_flush::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","iterator manual wal flush");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","iterator manual wal flush");
      }
      return;
    }
    local_b4 = fdb_iterator_get(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (local_b4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xdca);
      iterator_manual_wal_flush::__test_pass = 0;
      if (local_b4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xdca,"void iterator_manual_wal_flush()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11d193);
  } while( true );
}

Assistant:

void iterator_manual_wal_flush()
{
    TEST_INIT();
    memleak_start();

    int r;
    unsigned char key1[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  45,  0,  6, 49,  0,  0,  0};
    unsigned char key2[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  49, 45,  0,  6, 49, 50,  0,  0,
                                   0};
    unsigned char start_key1[] = { 8,  5, 62, 62, 52, 49, 57, 57,
                                  57, 45,  0};
    unsigned char start_key2[] = { 8,  5, 62, 62, 52, 51, 52, 53,
                                  10, 20,  0};
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    fdb_set_kv(db, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db, key2, sizeof(key2), NULL, 0);

    // normal commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    fdb_set_kv(db2, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db2, key2, sizeof(key2), NULL, 0);

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, NULL, 0,
                               start_key1, sizeof(start_key1), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key1, sizeof(start_key1), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, NULL, 0,
                               start_key2, sizeof(start_key2), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key2, sizeof(start_key2), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    while (fdb_iterator_prev(it) != FDB_RESULT_ITERATOR_FAIL) {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }
    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator manual wal flush");
}